

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

int __thiscall prometheus::Gateway::push(Gateway *this,HttpMethod method)

{
  int iVar1;
  pointer collectable_00;
  shared_ptr<prometheus::Collectable> collectable;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  string uri;
  string body;
  __shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> local_a8;
  pointer local_98;
  Serializer local_90;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_88;
  string local_70;
  string local_50;
  
  local_90._vptr_Serializer = (_func_int **)&PTR__Serializer_00126d08;
  ::std::mutex::lock(&this->mutex_);
  collectable_00 =
       (this->collectables_).
       super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->collectables_).
             super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (collectable_00 == local_98) {
      iVar1 = 200;
LAB_00106e6e:
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
      return iVar1;
    }
    ::std::__shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,collectable_00);
    if (local_a8._M_ptr != (element_type *)0x0) {
      (*(local_a8._M_ptr)->_vptr_Collectable[2])(&local_88);
      Serializer::Serialize_abi_cxx11_(&local_50,&local_90,&local_88);
      getUri(&local_70,this,collectable_00);
      iVar1 = detail::CurlWrapper::performHttpRequest
                        ((this->curlWrapper_)._M_t.
                         super___uniq_ptr_impl<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_prometheus::detail::CurlWrapper_*,_std::default_delete<prometheus::detail::CurlWrapper>_>
                         .super__Head_base<0UL,_prometheus::detail::CurlWrapper_*,_false>.
                         _M_head_impl,method,&local_70,&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_88);
      if (iVar1 - 400U < 0xfffffed4) {
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        goto LAB_00106e6e;
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    collectable_00 = collectable_00 + 1;
  } while( true );
}

Assistant:

int Gateway::push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = serializer.Serialize(metrics);
    auto uri = getUri(wcollectable);
    auto status_code = curlWrapper_->performHttpRequest(method, uri, body);

    if (status_code < 100 || status_code >= 400) {
      return status_code;
    }
  }

  return 200;
}